

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *__s;
  URL *this;
  long *plVar4;
  _Base_ptr p_Var5;
  size_type *psVar6;
  int iVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  string adress;
  Log log;
  HttpClient client;
  HttpResponse response;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  undefined1 *local_3d0;
  long local_3c8;
  undefined1 local_3c0 [16];
  string local_3b0;
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0 [2];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  Log local_190;
  string local_168;
  Log local_148;
  HttpClient local_120;
  HttpResponse local_f8;
  
  local_3d0 = local_3c0;
  local_3c8 = 0;
  local_3c0[0] = 0;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No URL adress provided",0x16);
    iVar7 = -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  else {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_3d0,0,(char *)0x0,(ulong)__s);
    Log::Log(&local_190,printOut);
    paVar3 = &local_148._logText.field_2;
    local_148._logText._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_190._logText._M_dataplus._M_p,
               local_190._logText._M_dataplus._M_p + local_190._logText._M_string_length);
    local_148._printFunction = local_190._printFunction;
    HttpClient::HttpClient(&local_120,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._logText._M_dataplus._M_p != paVar3) {
      operator_delete(local_148._logText._M_dataplus._M_p);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,local_3d0,local_3d0 + local_3c8);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"GET","");
    HttpClient::RunRequest(&local_f8,&local_120,&local_1b0,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Client was called, ok!","");
    printOut(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    this = HttpResponse::GetRequestURL(&local_f8);
    if (this == (URL *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The URL is dead",0xf);
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"Request information-------------------","");
    printOut(&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    URL::GetFullURL_abi_cxx11_((string *)&local_400,this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x108076);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2b0[0].field_2._0_8_ = *psVar6;
      local_2b0[0].field_2._8_8_ = plVar4[3];
      local_2b0[0]._M_dataplus._M_p = (pointer)&local_2b0[0].field_2;
    }
    else {
      local_2b0[0].field_2._0_8_ = *psVar6;
      local_2b0[0]._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2b0[0]._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0[0]._M_dataplus._M_p != &local_2b0[0].field_2) {
      operator_delete(local_2b0[0]._M_dataplus._M_p);
    }
    pp_Var1 = &local_400._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    URL::GetProtocoll_abi_cxx11_((string *)&local_400,this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x108081);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2d0.field_2._M_allocated_capacity = *psVar6;
      local_2d0.field_2._8_8_ = plVar4[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar6;
      local_2d0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2d0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    URL::GetHostName_abi_cxx11_((string *)&local_400,this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x10808d);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2f0.field_2._M_allocated_capacity = *psVar6;
      local_2f0.field_2._8_8_ = plVar4[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar6;
      local_2f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2f0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    URL::GetPortNumber_abi_cxx11_((string *)&local_400,this);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x108099);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_310.field_2._M_allocated_capacity = *psVar6;
      local_310.field_2._8_8_ = plVar4[3];
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    }
    else {
      local_310.field_2._M_allocated_capacity = *psVar6;
      local_310._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_310._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"Basic information---------------------","");
    printOut(&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    HttpResponse::GetHttpVersion_abi_cxx11_((string *)&local_400,&local_f8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x1080ce);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_330.field_2._M_allocated_capacity = *psVar6;
      local_330.field_2._8_8_ = plVar4[3];
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    }
    else {
      local_330.field_2._M_allocated_capacity = *psVar6;
      local_330._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_330._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    HttpResponse::GetHttpStatusCode_abi_cxx11_((string *)&local_400,&local_f8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x1080d8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_350.field_2._M_allocated_capacity = *psVar6;
      local_350.field_2._8_8_ = plVar4[3];
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    }
    else {
      local_350.field_2._M_allocated_capacity = *psVar6;
      local_350._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_350._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    HttpResponse::GetHttpStatusText_abi_cxx11_((string *)&local_400,&local_f8);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x1080e6);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_370.field_2._M_allocated_capacity = *psVar6;
      local_370.field_2._8_8_ = plVar4[3];
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    }
    else {
      local_370.field_2._M_allocated_capacity = *psVar6;
      local_370._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_370._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    printOut(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((_Base_ptr *)local_400._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_400._M_impl._0_8_);
    }
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Header information---------------------","");
    printOut(&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p);
    }
    HttpResponse::GetHttpHeaders_abi_cxx11_
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_400,&local_f8);
    p_Var2 = &local_400._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)local_400._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var5 = local_400._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_390[0] = local_380;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_390,*(long *)(p_Var5 + 1),
                   (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        std::__cxx11::string::append((char *)local_390);
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_390,*(ulong *)(p_Var5 + 2));
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_3b0.field_2._M_allocated_capacity = *psVar6;
          local_3b0.field_2._8_8_ = plVar4[3];
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        }
        else {
          local_3b0.field_2._M_allocated_capacity = *psVar6;
          local_3b0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_3b0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        printOut(&local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if (local_390[0] != local_380) {
          operator_delete(local_390[0]);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var2);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_270,"Raw response-------------------------","");
    printOut(&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    HttpResponse::GetRawResponse_abi_cxx11_(&local_168,&local_f8);
    printOut(&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._log._logText._M_dataplus._M_p != &local_f8._log._logText.field_2) {
      operator_delete(local_f8._log._logText._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_f8._headerMap._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._httpVersion._M_dataplus._M_p != &local_f8._httpVersion.field_2) {
      operator_delete(local_f8._httpVersion._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._httpStatusText._M_dataplus._M_p != &local_f8._httpStatusText.field_2) {
      operator_delete(local_f8._httpStatusText._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._httpStatusCode._M_dataplus._M_p != &local_f8._httpStatusCode.field_2) {
      operator_delete(local_f8._httpStatusCode._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._log._logText._M_dataplus._M_p != &local_120._log._logText.field_2) {
      operator_delete(local_120._log._logText._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._logText._M_dataplus._M_p != &local_190._logText.field_2) {
      operator_delete(local_190._logText._M_dataplus._M_p);
    }
    iVar7 = 0;
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv) {
  std::string adress;
  if (argc > 1) {
    adress = argv[1];
  } else {
    std::cout << "No URL adress provided" << "\n";
    return -1;
  }

  Log log(printOut);
  HttpClient client(log);

  try {
    HttpResponse response = client.RunRequest(adress, "GET");
    printOut("Client was called, ok!");
    URL* urlObject = response.GetRequestURL();

    if (urlObject == nullptr) {
      std::cout << "The URL is dead";
    }

    printOut("Request information-------------------");
    printOut("Full URL: " + urlObject->GetFullURL());
    printOut("Protocoll: " + urlObject->GetProtocoll());
    printOut("Host name: " + urlObject->GetHostName());
    printOut("Port number: " + urlObject->GetPortNumber());

    printOut("Basic information---------------------");
    printOut("Version: " + response.GetHttpVersion());
    printOut("Status code: " + response.GetHttpStatusCode());
    printOut("Status text: " + response.GetHttpStatusText());

    printOut("Header information---------------------");
    std::map<std::string, std::string> headers = response.GetHttpHeaders();
    std::map<std::string, std::string>::iterator it;
    for (it=headers.begin(); it != headers.end(); ++it) {
      printOut(it->first + ": " + it->second);
    }
    printOut("Raw response-------------------------");
    printOut(response.GetRawResponse());
  } catch (int e) {
      printOut("An unhandled exception occured");
  }
  return 0;
}